

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

string * __thiscall
CodeGen::generateEnumType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t i;
  ulong uVar4;
  
  iVar1 = (*n->px->_vptr_Node[3])();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(CONCAT44(extraout_var,iVar1) + 0x20));
  poVar3 = std::operator<<(this->os_,"enum ");
  poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
  std::operator<<(poVar3," {\n");
  iVar1 = (*n->px->_vptr_Node[7])();
  for (uVar4 = 0; CONCAT44(extraout_var_00,iVar1) != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<(this->os_,"    ");
    iVar2 = (*n->px->_vptr_Node[8])(n->px,uVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
    std::operator<<(poVar3,",\n");
  }
  std::operator<<(this->os_,"};\n\n");
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateEnumType(const NodePtr& n)
{
    string s = decorate(n->name());
    os_ << "enum " << s << " {\n";
    size_t c = n->names();
    for (size_t i = 0; i < c; ++i) {
        os_ << "    " << n->nameAt(i) << ",\n";
    }
    os_ << "};\n\n";
    return s;
}